

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool fileMatch(string *file,Instruction *I)

{
  StringRef LHS;
  bool bVar1;
  char *pcVar2;
  size_t in_RSI;
  StringRef RHS;
  DISubprogram *subprog;
  string *in_stack_ffffffffffffffc8;
  StringRef *in_stack_ffffffffffffffd0;
  
  llvm::Instruction::getFunction();
  pcVar2 = (char *)llvm::Function::getSubprogram();
  llvm::DIScope::getFile((DIScope *)0x1e09cf);
  RHS = llvm::DIFile::getFilename((DIFile *)0x1e09d7);
  llvm::StringRef::StringRef(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  LHS.Length = in_RSI;
  LHS.Data = pcVar2;
  bVar1 = llvm::operator==(LHS,RHS);
  return bVar1;
}

Assistant:

static bool fileMatch(const std::string &file, const llvm::Instruction &I) {
#if LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR <= 7
    const auto *F = I.getParent()->getParent();
    const auto *subprog = llvm::cast<llvm::DISubprogram>(
            F->getMetadata(llvm::LLVMContext::MD_dbg));
#else
    const auto *subprog = I.getFunction()->getSubprogram();
#endif
    return subprog->getFile()->getFilename() == file;
}